

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O1

QBitArray * QBitArray::fromBits(QBitArray *__return_storage_ptr__,char *data,qsizetype size)

{
  byte *pbVar1;
  Data *pDVar2;
  char *pcVar3;
  quint8 *c;
  
  (__return_storage_ptr__->d).d.d = (Data *)0x0;
  (__return_storage_ptr__->d).d.ptr = (char *)0x0;
  (__return_storage_ptr__->d).d.size = 0;
  if (0 < size) {
    QByteArray::resize(&__return_storage_ptr__->d,(size + 7U >> 3) + 1);
    pDVar2 = (__return_storage_ptr__->d).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>))
    {
      QByteArray::reallocData
                (&__return_storage_ptr__->d,(__return_storage_ptr__->d).d.size,KeepSize);
    }
    memcpy((__return_storage_ptr__->d).d.ptr + 1,data,(__return_storage_ptr__->d).d.size - 1);
    pDVar2 = (__return_storage_ptr__->d).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>))
    {
      QByteArray::reallocData
                (&__return_storage_ptr__->d,(__return_storage_ptr__->d).d.size,KeepSize);
    }
    pcVar3 = (__return_storage_ptr__->d).d.ptr;
    *pcVar3 = (char)((int)(__return_storage_ptr__->d).d.size << 3) - (char)size;
    if ((size & 7U) != 0) {
      pbVar1 = (byte *)(pcVar3 + ((ulong)size >> 3) + 1);
      *pbVar1 = *pbVar1 & ~(-1 << (sbyte)(size & 7U));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QBitArray QBitArray::fromBits(const char *data, qsizetype size)
{
    Q_ASSERT_X(size >= 0, "QBitArray::fromBits", "Size must be greater than or equal to 0.");
    QBitArray result;
    if (size <= 0)
        return result;

    auto &d = result.d;
    d.resize(allocation_size(size));
    memcpy(d.data() + 1, data, d.size() - 1);
    adjust_head_and_tail(d.data(), d.size(), size);
    return result;
}